

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

void Gia_ManHighLightFlopLogic(Gia_Man_t *p)

{
  undefined1 *puVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  
  pVVar7 = p->vCis;
  uVar8 = (ulong)(uint)pVVar7->nSize;
  if (p->nRegs < pVVar7->nSize) {
    lVar5 = 0;
    do {
      if ((int)uVar8 <= lVar5) goto LAB_001f738f;
      iVar6 = pVVar7->pArray[lVar5];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_001f7370;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &p->pObjs[iVar6].field_0x3;
      *puVar1 = *puVar1 & 0xbf;
      lVar5 = lVar5 + 1;
      pVVar7 = p->vCis;
      uVar8 = (ulong)pVVar7->nSize;
    } while (lVar5 < (long)(uVar8 - (long)p->nRegs));
  }
  iVar6 = p->nRegs;
  if (0 < iVar6) {
    iVar4 = 0;
    do {
      iVar2 = p->vCis->nSize;
      uVar9 = (iVar2 - iVar6) + iVar4;
      if (((int)uVar9 < 0) || (iVar2 <= (int)uVar9)) {
LAB_001f738f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar6 = p->vCis->pArray[uVar9];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_001f7370;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      puVar1 = &p->pObjs[iVar6].field_0x3;
      *puVar1 = *puVar1 | 0x40;
      iVar4 = iVar4 + 1;
      iVar6 = p->nRegs;
    } while (iVar4 < iVar6);
  }
  if (0 < p->nObjs) {
    lVar5 = 0;
    lVar10 = 0;
    do {
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      uVar8 = *(ulong *)(&pGVar3->field_0x0 + lVar5);
      if ((uVar8 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar8) {
        *(ulong *)(&pGVar3->field_0x0 + lVar5) =
             uVar8 & 0xffffffff3fffffff |
             (ulong)((*(uint *)((long)pGVar3 +
                               (ulong)((uint)(uVar8 >> 0x1e) & 0x7ffffffc) * -3 + lVar5) |
                     *(uint *)((long)pGVar3 +
                              (ulong)(uint)((int)(uVar8 & 0x1fffffff) << 2) * -3 + lVar5)) &
                    0x40000000);
      }
      lVar10 = lVar10 + 1;
      lVar5 = lVar5 + 0xc;
    } while (lVar10 < p->nObjs);
  }
  pVVar7 = p->vCos;
  if (0 < pVVar7->nSize) {
    lVar5 = 0;
    do {
      iVar6 = pVVar7->pArray[lVar5];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
LAB_001f7370:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return;
      }
      pGVar3 = p->pObjs + iVar6;
      *(ulong *)pGVar3 =
           *(ulong *)pGVar3 & 0xffffffffbfffffff |
           (ulong)((uint)*(undefined8 *)(pGVar3 + -(ulong)((uint)*(ulong *)pGVar3 & 0x1fffffff)) &
                  0x40000000);
      lVar5 = lVar5 + 1;
      pVVar7 = p->vCos;
    } while (lVar5 < pVVar7->nSize);
  }
  return;
}

Assistant:

void Gia_ManHighLightFlopLogic( Gia_Man_t * p )
{
    Gia_Obj_t * pObj; int i;
    Gia_ManForEachPi( p, pObj, i )
        pObj->fMark0 = 0;
    Gia_ManForEachRo( p, pObj, i )
        pObj->fMark0 = 1;
    Gia_ManForEachAnd( p, pObj, i )
        pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 | Gia_ObjFanin1(pObj)->fMark0;
    Gia_ManForEachCo( p, pObj, i )
        pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0;
}